

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SaturationAlgorithm.cpp
# Opt level: O1

UnitList * __thiscall
Saturation::SaturationAlgorithm::collectSaturatedSet(SaturationAlgorithm *this)

{
  undefined1 *puVar1;
  long *plVar2;
  Cell *pCVar3;
  Cell *pCVar4;
  char cVar5;
  long *plVar6;
  Unit *pUVar7;
  UnitList *pUVar8;
  UnitList *pUVar9;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  
  pCVar3 = (this->_active->_clauses)._entries;
  pCVar4 = (this->_active->_clauses)._afterLast;
  plVar6 = (long *)::Lib::FixedSizeAllocator<32UL>::alloc
                             ((FixedSizeAllocator<32UL> *)
                              (::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
  *plVar6 = (long)&PTR__IteratorCore_00b6b848;
  local_38 = SUB84(pCVar3,0);
  uStack_34 = (undefined4)((ulong)pCVar3 >> 0x20);
  uStack_30 = SUB84(pCVar4,0);
  uStack_2c = (undefined4)((ulong)pCVar4 >> 0x20);
  *(undefined4 *)(plVar6 + 2) = local_38;
  *(undefined4 *)((long)plVar6 + 0x14) = uStack_34;
  *(undefined4 *)(plVar6 + 3) = uStack_30;
  *(undefined4 *)((long)plVar6 + 0x1c) = uStack_2c;
  *(undefined4 *)(plVar6 + 1) = 1;
  pUVar9 = (UnitList *)0x0;
  while( true ) {
    cVar5 = (**(code **)(*plVar6 + 0x10))(plVar6);
    if (cVar5 == '\0') break;
    pUVar7 = (Unit *)(**(code **)(*plVar6 + 0x18))(plVar6);
    puVar1 = &pUVar7[1]._inference.field_0x8;
    *(int *)puVar1 = *(int *)puVar1 + 1;
    pUVar8 = (UnitList *)
             ::Lib::FixedSizeAllocator<16UL>::alloc
                       ((FixedSizeAllocator<16UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
    pUVar8->_head = pUVar7;
    pUVar8->_tail = pUVar9;
    pUVar9 = pUVar8;
  }
  plVar2 = plVar6 + 1;
  *(int *)plVar2 = (int)*plVar2 + -1;
  if ((int)*plVar2 == 0) {
    (**(code **)(*plVar6 + 8))(plVar6);
  }
  return pUVar9;
}

Assistant:

UnitList *SaturationAlgorithm::collectSaturatedSet()
{
  UnitList* res = 0;
  ClauseIterator it = _active->clauses();
  while (it.hasNext()) {
    Clause* cl = it.next();
    cl->incRefCnt();
    UnitList::push(cl, res);
  }
  return res;
}